

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmLibrary.cpp
# Opt level: O0

void Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(FunctionBody *body)

{
  code *pcVar1;
  bool bVar2;
  FunctionEntryPointInfo *pFVar3;
  undefined4 *puVar4;
  FunctionBody *body_local;
  
  pFVar3 = FunctionBody::GetDefaultFunctionEntryPointInfo(body);
  EntryPointInfo::SetIsAsmJSFunction(&pFVar3->super_EntryPointInfo,true);
  pFVar3 = FunctionBody::GetDefaultFunctionEntryPointInfo(body);
  (pFVar3->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod =
       InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
  FunctionProxy::SetOriginalEntryPoint
            ((FunctionProxy *)body,InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk);
  FunctionBody::SetIsAsmJsFullJitScheduled(body,false);
  bVar2 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)body);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x1f,"(body->HasValidEntryPoint())","body->HasValidEntryPoint()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void WasmLibrary::ResetFunctionBodyDefaultEntryPoint(FunctionBody* body)
    {
        body->GetDefaultFunctionEntryPointInfo()->SetIsAsmJSFunction(true);
        body->GetDefaultFunctionEntryPointInfo()->jsMethod = AsmJsDefaultEntryThunk;
        body->SetOriginalEntryPoint(AsmJsDefaultEntryThunk);
        // Reset jit status for this function
        body->SetIsAsmJsFullJitScheduled(false);
        Assert(body->HasValidEntryPoint());
    }